

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

bool tcu::anon_unknown_3::verifySinglesampleWideLineGroupInterpolation
               (Surface *surface,LineSceneSpec *scene,RasterizationArguments *args,TestLog *log)

{
  allocator<bool> *this;
  Vector<int,_3> *pVVar1;
  RGBA RVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  deBool dVar6;
  size_type sVar7;
  MessageBuilder *pMVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  uint *puVar12;
  const_reference pvVar13;
  long lVar14;
  IVec3 *pIVar15;
  Vec3 *pVVar16;
  TestLog *pTVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  reference rVar26;
  bool local_15d5;
  deUint32 local_15cc;
  bool local_15a2;
  uint local_157c;
  float *local_1548;
  int local_153c;
  allocator<char> local_1451;
  string local_1450;
  allocator<char> local_1429;
  string local_1428;
  LogImage local_1408;
  allocator<char> local_1371;
  string local_1370;
  allocator<char> local_1349;
  string local_1348;
  LogImageSet local_1328;
  MessageBuilder local_12e8;
  allocator<char> local_1161;
  string local_1160;
  allocator<char> local_1139;
  string local_1138;
  LogImage local_1118;
  allocator<char> local_1081;
  string local_1080;
  allocator<char> local_1059;
  string local_1058;
  LogImage local_1038;
  allocator<char> local_fa1;
  string local_fa0;
  allocator<char> local_f79;
  string local_f78;
  LogImageSet local_f58;
  MessageBuilder local_f18;
  int local_d94;
  MessageBuilder local_d90;
  Vector<float,_3> local_c10;
  Vector<float,_3> local_c04;
  Vector<float,_3> local_bf8;
  Vector<float,_3> local_bec;
  Vector<float,_3> local_be0;
  Vector<float,_3> local_bd4;
  Vector<float,_3> local_bc8;
  Vector<float,_3> local_bbc;
  Vector<float,_3> local_bb0;
  Vector<float,_3> local_ba4;
  Vector<float,_3> local_b98;
  Vector<float,_3> local_b8c;
  Vector<int,_3> local_b80;
  Vector<int,_3> local_b74;
  Vector<int,_3> local_b68;
  Vector<int,_3> local_b5c;
  InterpolationPointCandidate *local_b50;
  InterpolationPointCandidate *interpolationCandidate_1;
  reference pvStack_b40;
  int interpolationCandidateNdx;
  SingleSampleWideLineCandidate *candidate_1;
  int lineCandidateNdx;
  MessageBuilder msg;
  undefined1 local_9a8 [12];
  undefined1 local_99c [20];
  InterpolationPointCandidate *interpolationCandidate;
  IVec3 colorMax;
  IVec3 colorMin;
  Vec3 colorMaxF;
  Vec3 colorMinF;
  Vector<float,_4> local_944;
  undefined1 local_934 [8];
  Vec4 valueMax;
  Vector<float,_4> local_914;
  undefined1 local_904 [8];
  Vec4 valueMin;
  LineInterpolationRange range;
  Vector<int,_2> local_8d8;
  IVec2 rootPosition;
  int minorOffset;
  SingleSampleWideLineCandidate candidate;
  IVec2 minorDirection;
  IVec2 idealRootPos;
  int minorPosition;
  deUint32 minorInfoPacked;
  int majorPosition;
  _Bit_type local_7b0;
  byte local_7a5;
  undefined1 local_7a4 [7];
  bool isXMajor_2;
  Vec2 pb;
  Vec2 pa;
  float wb;
  float wa;
  int lineNdx_2;
  PixelBufferAccess local_780;
  undefined1 local_754 [24];
  int coverage;
  int dx;
  int dy;
  vector<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>_>
  candidates;
  IVec3 formatLimit;
  uint uStack_708;
  bool matchFound;
  int lineSurroundingCoverage;
  int lineCoverageSet;
  IVec3 pixelNativeColor;
  RGBA color;
  int x;
  int y;
  int majorPos_1;
  deUint32 packed;
  int rootPos;
  int majorPos;
  IVec2 fragPos;
  int packetNdx;
  Vector<float,_4> local_6bc;
  undefined1 local_6ac [8];
  undefined1 local_6a4 [8];
  Vector<float,_2> local_69c;
  Vec2 expandedP1;
  undefined1 local_68c [8];
  Vector<float,_2> local_684;
  Vec2 expandedP0;
  int numRasterized;
  LineExitDiamond diamonds [32];
  LineExitDiamondGenerator diamondGenerator;
  int majorSize;
  int local_520;
  undefined1 auStack_51c [3];
  bool isXMajor_1;
  int lineNdx_1;
  float local_514 [2];
  Vector<float,_2> local_50c;
  Vec2 offset;
  Vec2 offsetDirection;
  float offsetLength;
  undefined1 local_4e4 [7];
  bool isXMajor;
  Vec2 lineScreenSpaceP1;
  Vec2 lineScreenSpaceP0;
  int lineNdx;
  allocator<tcu::Vector<float,_4>_> local_4a1;
  undefined1 local_4a0 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> screenspaceLines;
  PixelBufferAccess local_478;
  Vector<int,_4> local_450;
  PixelBufferAccess local_440;
  TextureFormat local_418;
  undefined1 local_410 [8];
  TextureLevel referenceLineMap;
  MessageBuilder local_268;
  allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_e1;
  undefined1 local_e0 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  rootPixelLocation;
  undefined1 local_c0 [8];
  vector<bool,_std::allocator<bool>_> lineIsXMajor;
  allocator<tcu::Vector<float,_4>_> local_81;
  undefined1 local_80 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> effectiveLines;
  undefined1 local_60 [4];
  int invalidPixels;
  Surface errorMask;
  int errorCount;
  int errorFloodThreshold;
  IVec2 viewportSize;
  RGBA invalidPixelColor;
  TestLog *log_local;
  RasterizationArguments *args_local;
  LineSceneSpec *scene_local;
  Surface *surface_local;
  
  unique0x10003b5d = log;
  RGBA::RGBA((RGBA *)&viewportSize,0xff,0,0,0xff);
  iVar4 = Surface::getWidth(surface);
  iVar5 = Surface::getHeight(surface);
  Vector<int,_2>::Vector((Vector<int,_2> *)&errorCount,iVar4,iVar5);
  errorMask.m_pixels.m_cap._4_4_ = 0;
  iVar4 = Surface::getWidth(surface);
  iVar5 = Surface::getHeight(surface);
  Surface::Surface((Surface *)local_60,iVar4,iVar5);
  effectiveLines.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  sVar7 = std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
          ::size(&scene->lines);
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_81);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_80,
             sVar7,&local_81);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_81);
  sVar7 = std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
          ::size(&scene->lines);
  this = (allocator<bool> *)
         ((long)&rootPixelLocation.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<bool>::allocator(this);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_c0,sVar7,this);
  std::allocator<bool>::~allocator
            ((allocator<bool> *)
             ((long)&rootPixelLocation.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sVar7 = std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
          ::size(&scene->lines);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator(&local_e1);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_e0,sVar7,&local_e1);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator(&local_e1);
  TestLog::operator<<(&local_268,stack0xffffffffffffffd0,(BeginMessageToken *)&TestLog::Message);
  pMVar8 = MessageBuilder::operator<<
                     (&local_268,
                      (char (*) [53])"Verifying rasterization result. Native format is RGB");
  pMVar8 = MessageBuilder::operator<<(pMVar8,&args->redBits);
  pMVar8 = MessageBuilder::operator<<(pMVar8,&args->greenBits);
  pMVar8 = MessageBuilder::operator<<(pMVar8,&args->blueBits);
  MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&TestLog::EndMessage);
  MessageBuilder::~MessageBuilder(&local_268);
  if (((8 < args->redBits) || (8 < args->greenBits)) || (8 < args->blueBits)) {
    TestLog::operator<<((MessageBuilder *)&referenceLineMap.m_data.m_cap,stack0xffffffffffffffd0,
                        (BeginMessageToken *)&TestLog::Message);
    pMVar8 = MessageBuilder::operator<<
                       ((MessageBuilder *)&referenceLineMap.m_data.m_cap,
                        (char (*) [80])
                        "Warning! More than 8 bits in a color channel, this may produce false negatives."
                       );
    MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&TestLog::EndMessage);
    MessageBuilder::~MessageBuilder((MessageBuilder *)&referenceLineMap.m_data.m_cap);
  }
  TextureFormat::TextureFormat(&local_418,R,UNSIGNED_INT8);
  iVar4 = Surface::getWidth(surface);
  iVar5 = Surface::getHeight(surface);
  TextureLevel::TextureLevel((TextureLevel *)local_410,&local_418,iVar4,iVar5,1);
  TextureLevel::getAccess(&local_440,(TextureLevel *)local_410);
  Vector<int,_4>::Vector(&local_450,0,0,0,0);
  tcu::clear(&local_440,&local_450);
  Surface::getAccess(&local_478,(Surface *)local_60);
  Vector<float,_4>::Vector
            ((Vector<float,_4> *)
             &screenspaceLines.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0.0,0.0,0.0,1.0);
  tcu::clear(&local_478,
             (Vec4 *)&screenspaceLines.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar7 = std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
          ::size(&scene->lines);
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_4a1);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_4a0,
             sVar7,&local_4a1);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_4a1);
  genScreenSpaceLines((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_4a0,&scene->lines,(IVec2 *)&errorCount);
  fVar18 = scene->lineWidth;
  TextureLevel::getAccess
            ((PixelBufferAccess *)(lineScreenSpaceP0.m_data + 1),(TextureLevel *)local_410);
  setMaskMapCoverageBitForLines
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_4a0,
             fVar18,(PixelBufferAccess *)(lineScreenSpaceP0.m_data + 1));
  for (lineScreenSpaceP0.m_data[0] = 0.0; fVar18 = lineScreenSpaceP0.m_data[0],
      sVar7 = std::
              vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
              ::size(&scene->lines), (int)fVar18 < (int)sVar7;
      lineScreenSpaceP0.m_data[0] = (float)((int)lineScreenSpaceP0.m_data[0] + 1)) {
    pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_4a0,(long)(int)lineScreenSpaceP0.m_data[0]);
    Vector<float,_4>::swizzle((Vector<float,_4> *)&lineScreenSpaceP1,(int)pvVar9,0);
    pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_4a0,(long)(int)lineScreenSpaceP0.m_data[0]);
    Vector<float,_4>::swizzle((Vector<float,_4> *)local_4e4,(int)pvVar9,2);
    pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_4a0,(long)(int)lineScreenSpaceP0.m_data[0]);
    bVar3 = isPackedSSLineXMajor(pvVar9);
    rVar26 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)local_c0,
                        (long)(int)lineScreenSpaceP0.m_data[0]);
    register0x00000000 = rVar26._M_p;
    std::_Bit_reference::operator=((_Bit_reference *)(offsetDirection.m_data + 1),bVar3);
    offsetDirection.m_data[0] = (scene->lineWidth - 1.0) / 2.0;
    if (bVar3) {
      Vector<float,_2>::Vector(&offset,0.0,-1.0);
    }
    else {
      Vector<float,_2>::Vector(&offset,-1.0,0.0);
    }
    tcu::operator*((tcu *)&local_50c,&offset,offsetDirection.m_data[0]);
    fVar18 = Vector<float,_2>::x(&lineScreenSpaceP1);
    fVar19 = Vector<float,_2>::x(&local_50c);
    fVar20 = Vector<float,_2>::y(&lineScreenSpaceP1);
    fVar21 = Vector<float,_2>::y(&local_50c);
    fVar22 = Vector<float,_2>::x((Vector<float,_2> *)local_4e4);
    fVar23 = Vector<float,_2>::x(&local_50c);
    fVar24 = Vector<float,_2>::y((Vector<float,_2> *)local_4e4);
    fVar25 = Vector<float,_2>::y(&local_50c);
    Vector<float,_4>::Vector
              ((Vector<float,_4> *)auStack_51c,fVar18 + fVar19,fVar20 + fVar21,fVar22 + fVar23,
               fVar24 + fVar25);
    pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_80,(long)(int)lineScreenSpaceP0.m_data[0]);
    *(undefined8 *)pvVar9->m_data = _auStack_51c;
    *(float (*) [2])(pvVar9->m_data + 2) = local_514;
  }
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_4a0);
  local_520 = 0;
  while( true ) {
    sVar7 = std::
            vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
            size(&scene->lines);
    if ((int)sVar7 <= local_520) break;
    rVar26 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)local_c0,(long)local_520);
    register0x00000000 = rVar26._M_p;
    bVar3 = std::_Bit_reference::operator_cast_to_bool
                      ((_Bit_reference *)(diamondGenerator.m_curPos.m_data + 1));
    if (bVar3) {
      local_153c = Surface::getWidth(surface);
    }
    else {
      local_153c = Surface::getHeight(surface);
    }
    diamondGenerator.m_curPos.m_data[0] = local_153c;
    rr::LineExitDiamondGenerator::LineExitDiamondGenerator
              ((LineExitDiamondGenerator *)(diamonds[0x1f].position.m_data + 1));
    local_1548 = expandedP0.m_data + 1;
    do {
      rr::LineExitDiamond::LineExitDiamond((LineExitDiamond *)local_1548);
      local_1548 = local_1548 + 2;
    } while ((LineExitDiamond *)local_1548 != diamonds + 0x1f);
    expandedP0.m_data[0] = 4.48416e-44;
    pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_80,(long)local_520);
    Vector<float,_4>::swizzle((Vector<float,_4> *)local_68c,(int)pvVar9,0);
    pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_80,(long)local_520);
    Vector<float,_4>::swizzle((Vector<float,_4> *)&expandedP1,(int)pvVar9,2);
    getLineCoordAtAxisCoord((anon_unknown_3 *)&local_684,(Vec2 *)local_68c,&expandedP1,bVar3,-1.0);
    pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_80,(long)local_520);
    Vector<float,_4>::swizzle((Vector<float,_4> *)local_6a4,(int)pvVar9,0);
    pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_80,(long)local_520);
    Vector<float,_4>::swizzle((Vector<float,_4> *)local_6ac,(int)pvVar9,2);
    getLineCoordAtAxisCoord
              ((anon_unknown_3 *)&local_69c,(Vec2 *)local_6a4,(Vec2 *)local_6ac,bVar3,
               (float)diamondGenerator.m_curPos.m_data[0] + 1.0);
    fVar18 = Vector<float,_2>::x(&local_684);
    fVar19 = Vector<float,_2>::y(&local_684);
    Vector<float,_4>::Vector(&local_6bc,fVar18,fVar19,0.0,1.0);
    fVar18 = Vector<float,_2>::x(&local_69c);
    fVar19 = Vector<float,_2>::y(&local_69c);
    Vector<float,_4>::Vector((Vector<float,_4> *)&packetNdx,fVar18,fVar19,0.0,1.0);
    rr::LineExitDiamondGenerator::init
              ((LineExitDiamondGenerator *)(diamonds[0x1f].position.m_data + 1),
               (EVP_PKEY_CTX *)&local_6bc);
    pvVar10 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            *)local_e0,(long)local_520);
    fragPos.m_data[1] = 0x10000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (pvVar10,(long)diamondGenerator.m_curPos.m_data[0],
               (value_type_conflict2 *)(fragPos.m_data + 1));
    while (expandedP0.m_data[0] == 4.48416e-44) {
      rr::LineExitDiamondGenerator::rasterize
                ((LineExitDiamondGenerator *)(diamonds[0x1f].position.m_data + 1),
                 (LineExitDiamond *)(expandedP0.m_data + 1),0x20,(int *)&expandedP0);
      for (fragPos.m_data[0] = 0; fragPos.m_data[0] < (int)expandedP0.m_data[0];
          fragPos.m_data[0] = fragPos.m_data[0] + 1) {
        Vector<int,_2>::Vector
                  ((Vector<int,_2> *)&rootPos,
                   (Vector<int,_2> *)((&expandedP0)[fragPos.m_data[0]].m_data + 1));
        if (bVar3) {
          iVar4 = Vector<int,_2>::x((Vector<int,_2> *)&rootPos);
          local_157c = Vector<int,_2>::y((Vector<int,_2> *)&rootPos);
        }
        else {
          iVar4 = Vector<int,_2>::y((Vector<int,_2> *)&rootPos);
          local_157c = Vector<int,_2>::x((Vector<int,_2> *)&rootPos);
        }
        dVar6 = deInBounds32(iVar4,0,diamondGenerator.m_curPos.m_data[0]);
        if (dVar6 != 0) {
          pvVar10 = std::
                    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                  *)local_e0,(long)local_520);
          pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (pvVar10,(long)iVar4);
          *pvVar11 = local_157c & 0xffff;
        }
      }
    }
    for (x = 0; x < diamondGenerator.m_curPos.m_data[0]; x = x + 1) {
    }
    rr::LineExitDiamondGenerator::~LineExitDiamondGenerator
              ((LineExitDiamondGenerator *)(diamonds[0x1f].position.m_data + 1));
    local_520 = local_520 + 1;
  }
  color.m_value = 1;
  do {
    RVar2.m_value = color.m_value;
    iVar4 = Surface::getHeight(surface);
    if (iVar4 + -1 <= (int)RVar2.m_value) {
      if (4 < errorMask.m_pixels.m_cap._4_4_) {
        TestLog::operator<<(&local_d90,stack0xffffffffffffffd0,
                            (BeginMessageToken *)&TestLog::Message);
        pMVar8 = MessageBuilder::operator<<(&local_d90,(char (*) [9])"Omitted ");
        local_d94 = errorMask.m_pixels.m_cap._4_4_ + -4;
        pMVar8 = MessageBuilder::operator<<(pMVar8,&local_d94);
        pMVar8 = MessageBuilder::operator<<(pMVar8,(char (*) [29])" pixel error description(s).");
        MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&TestLog::EndMessage);
        MessageBuilder::~MessageBuilder(&local_d90);
      }
      bVar3 = effectiveLines.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0;
      if (bVar3) {
        TestLog::operator<<(&local_12e8,stack0xffffffffffffffd0,
                            (BeginMessageToken *)&TestLog::Message);
        pMVar8 = MessageBuilder::operator<<(&local_12e8,(char (*) [25])"No invalid pixels found.");
        MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&TestLog::EndMessage);
        MessageBuilder::~MessageBuilder(&local_12e8);
        pTVar17 = stack0xffffffffffffffd0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1348,"Verification result",&local_1349);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1370,"Result of rendering",&local_1371);
        LogImageSet::LogImageSet(&local_1328,&local_1348,&local_1370);
        pTVar17 = TestLog::operator<<(pTVar17,&local_1328);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1428,"Result",&local_1429);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1450,"Result",&local_1451);
        LogImage::LogImage(&local_1408,&local_1428,&local_1450,surface,
                           QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar17 = TestLog::operator<<(pTVar17,&local_1408);
        TestLog::operator<<(pTVar17,(EndImageSetToken *)&TestLog::EndImageSet);
        LogImage::~LogImage(&local_1408);
        std::__cxx11::string::~string((string *)&local_1450);
        std::allocator<char>::~allocator(&local_1451);
        std::__cxx11::string::~string((string *)&local_1428);
        std::allocator<char>::~allocator(&local_1429);
        LogImageSet::~LogImageSet(&local_1328);
        std::__cxx11::string::~string((string *)&local_1370);
        std::allocator<char>::~allocator(&local_1371);
        std::__cxx11::string::~string((string *)&local_1348);
        std::allocator<char>::~allocator(&local_1349);
      }
      else {
        TestLog::operator<<(&local_f18,stack0xffffffffffffffd0,
                            (BeginMessageToken *)&TestLog::Message);
        pMVar8 = MessageBuilder::operator<<
                           (&local_f18,
                            (int *)((long)&effectiveLines.
                                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        pMVar8 = MessageBuilder::operator<<(pMVar8,(char (*) [25])" invalid pixel(s) found.");
        MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&TestLog::EndMessage);
        MessageBuilder::~MessageBuilder(&local_f18);
        pTVar17 = stack0xffffffffffffffd0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f78,"Verification result",&local_f79);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_fa0,"Result of rendering",&local_fa1);
        LogImageSet::LogImageSet(&local_f58,&local_f78,&local_fa0);
        pTVar17 = TestLog::operator<<(pTVar17,&local_f58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1058,"Result",&local_1059);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1080,"Result",&local_1081);
        LogImage::LogImage(&local_1038,&local_1058,&local_1080,surface,
                           QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar17 = TestLog::operator<<(pTVar17,&local_1038);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1138,"ErrorMask",&local_1139);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1160,"ErrorMask",&local_1161);
        LogImage::LogImage(&local_1118,&local_1138,&local_1160,(Surface *)local_60,
                           QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar17 = TestLog::operator<<(pTVar17,&local_1118);
        TestLog::operator<<(pTVar17,(EndImageSetToken *)&TestLog::EndImageSet);
        LogImage::~LogImage(&local_1118);
        std::__cxx11::string::~string((string *)&local_1160);
        std::allocator<char>::~allocator(&local_1161);
        std::__cxx11::string::~string((string *)&local_1138);
        std::allocator<char>::~allocator(&local_1139);
        LogImage::~LogImage(&local_1038);
        std::__cxx11::string::~string((string *)&local_1080);
        std::allocator<char>::~allocator(&local_1081);
        std::__cxx11::string::~string((string *)&local_1058);
        std::allocator<char>::~allocator(&local_1059);
        LogImageSet::~LogImageSet(&local_f58);
        std::__cxx11::string::~string((string *)&local_fa0);
        std::allocator<char>::~allocator(&local_fa1);
        std::__cxx11::string::~string((string *)&local_f78);
        std::allocator<char>::~allocator(&local_f79);
      }
      TextureLevel::~TextureLevel((TextureLevel *)local_410);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)local_e0);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_c0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_80)
      ;
      Surface::~Surface((Surface *)local_60);
      return bVar3;
    }
    pixelNativeColor.m_data[2] = 1;
    while( true ) {
      iVar4 = pixelNativeColor.m_data[2];
      iVar5 = Surface::getWidth(surface);
      if (iVar5 + -1 <= iVar4) break;
      pixelNativeColor.m_data[1] =
           (int)Surface::getPixel(surface,pixelNativeColor.m_data[2],color.m_value);
      convertRGB8ToNativeFormat
                ((anon_unknown_3 *)&lineSurroundingCoverage,(RGBA *)(pixelNativeColor.m_data + 1),
                 args);
      uStack_708 = 0;
      formatLimit.m_data[2] = 0xffff;
      bVar3 = false;
      Vector<int,_3>::Vector
                ((Vector<int,_3> *)
                 ((long)&candidates.
                         super__Vector_base<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                 (1 << ((byte)args->redBits & 0x1f)) + -1,(1 << ((byte)args->greenBits & 0x1f)) + -1
                 ,(1 << ((byte)args->blueBits & 0x1f)) + -1);
      std::
      vector<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>_>
      ::vector((vector<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>_>
                *)&dx);
      for (coverage = -1; coverage < 2; coverage = coverage + 1) {
        for (local_754._20_4_ = -1; (int)local_754._20_4_ < 2;
            local_754._20_4_ = local_754._20_4_ + 1) {
          TextureLevel::getAccess(&local_780,(TextureLevel *)local_410);
          ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_754,(int)&local_780,
                     pixelNativeColor.m_data[2] + local_754._20_4_,color.m_value + coverage);
          puVar12 = (uint *)Vector<int,_4>::x((Vector<int,_4> *)local_754);
          local_754._16_4_ = *puVar12;
          uStack_708 = local_754._16_4_ | uStack_708;
          formatLimit.m_data[2] = local_754._16_4_ & formatLimit.m_data[2];
        }
      }
      local_15a2 = false;
      if (formatLimit.m_data[2] == 0) {
        lineNdx_2 = (int)RGBA::black();
        local_15a2 = compareColors((RGBA *)(pixelNativeColor.m_data + 1),(RGBA *)&lineNdx_2,
                                   args->redBits,args->greenBits,args->blueBits);
      }
      if (local_15a2 == false) {
        wb = 0.0;
        while( true ) {
          sVar7 = std::
                  vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                  ::size(&scene->lines);
          if ((int)sVar7 <= (int)wb) break;
          if (((int)uStack_708 >> (SUB41(wb,0) & 0x1f) & 1U) != 0) {
            pvVar13 = std::
                      vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                      ::operator[](&scene->lines,(long)(int)wb);
            fVar18 = Vector<float,_4>::w(pvVar13->positions);
            pvVar13 = std::
                      vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                      ::operator[](&scene->lines,(long)(int)wb);
            fVar19 = Vector<float,_4>::w(pvVar13->positions + 1);
            pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                     operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 *)local_80,(long)(int)wb);
            Vector<float,_4>::swizzle((Vector<float,_4> *)&pb,(int)pvVar9,0);
            pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                     operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 *)local_80,(long)(int)wb);
            Vector<float,_4>::swizzle((Vector<float,_4> *)local_7a4,(int)pvVar9,2);
            rVar26 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)local_c0,(long)(int)wb);
            _minorInfoPacked = rVar26;
            local_7a5 = std::_Bit_reference::operator_cast_to_bool
                                  ((_Bit_reference *)&minorInfoPacked);
            if ((bool)local_7a5) {
              local_15cc = pixelNativeColor.m_data[2];
            }
            else {
              local_15cc = color.m_value;
            }
            pvVar10 = std::
                      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    *)local_e0,(long)(int)wb);
            pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (pvVar10,(long)(int)local_15cc);
            if ((local_7a5 & 1) == 0) {
              Vector<int,_2>::Vector(&minorDirection,(int)(short)*pvVar11,local_15cc);
            }
            else {
              Vector<int,_2>::Vector(&minorDirection,local_15cc,(int)(short)*pvVar11);
            }
            if ((local_7a5 & 1) == 0) {
              Vector<int,_2>::Vector
                        ((Vector<int,_2> *)
                         (candidate.interpolationCandidates[2].valueRangeMax.m_data + 1),1,0);
            }
            else {
              Vector<int,_2>::Vector
                        ((Vector<int,_2> *)
                         (candidate.interpolationCandidates[2].valueRangeMax.m_data + 1),0,1);
            }
            SingleSampleWideLineCandidate::SingleSampleWideLineCandidate
                      ((SingleSampleWideLineCandidate *)(rootPosition.m_data + 1));
            rootPosition.m_data[1] = (int)wb;
            minorOffset = 0;
            for (rootPosition.m_data[0] = -1; rootPosition.m_data[0] < 2;
                rootPosition.m_data[0] = rootPosition.m_data[0] + 1) {
              tcu::operator*((tcu *)(range.min.m_data + 1),rootPosition.m_data[0],
                             (Vector<int,_2> *)
                             (candidate.interpolationCandidates[2].valueRangeMax.m_data + 1));
              tcu::operator+((tcu *)&local_8d8,&minorDirection,
                             (Vector<int,_2> *)(range.min.m_data + 1));
              iVar4 = Vector<int,_2>::x(&local_8d8);
              iVar5 = Surface::getWidth(surface);
              dVar6 = deInBounds32(iVar4,0,iVar5);
              local_15d5 = false;
              if (dVar6 != 0) {
                iVar4 = Vector<int,_2>::y(&local_8d8);
                iVar5 = Surface::getHeight(surface);
                dVar6 = deInBounds32(iVar4,0,iVar5);
                local_15d5 = false;
                if (dVar6 != 0) {
                  iVar4 = Vector<int,_2>::x(&local_8d8);
                  iVar5 = Vector<int,_2>::y(&local_8d8);
                  range.min.m_data[0] = (float)Surface::getPixel(surface,iVar4,iVar5);
                  local_15d5 = isBlack((RGBA *)&range.min);
                }
              }
              if (local_15d5 == false) {
                calcSingleSampleLineInterpolationRange
                          ((anon_unknown_3 *)(valueMin.m_data + 2),&pb,fVar18,(Vec2 *)local_7a4,
                           fVar19,&local_8d8,args->subpixelBits);
                fVar20 = Vector<float,_2>::x(&range.max);
                fVar20 = de::clamp<float>(fVar20,0.0,1.0);
                pvVar13 = std::
                          vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                          ::operator[](&scene->lines,(long)(int)wb);
                tcu::operator*((tcu *)&local_914,fVar20,pvVar13->colors);
                fVar20 = Vector<float,_2>::y(&range.max);
                fVar20 = de::clamp<float>(fVar20,0.0,1.0);
                pvVar13 = std::
                          vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                          ::operator[](&scene->lines,(long)(int)wb);
                tcu::operator*((tcu *)(valueMax.m_data + 2),fVar20,pvVar13->colors + 1);
                tcu::operator+((tcu *)local_904,&local_914,(Vector<float,_4> *)(valueMax.m_data + 2)
                              );
                fVar20 = Vector<float,_2>::x((Vector<float,_2> *)(valueMin.m_data + 2));
                fVar20 = de::clamp<float>(fVar20,0.0,1.0);
                pvVar13 = std::
                          vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                          ::operator[](&scene->lines,(long)(int)wb);
                tcu::operator*((tcu *)&local_944,fVar20,pvVar13->colors);
                fVar20 = Vector<float,_2>::y((Vector<float,_2> *)(valueMin.m_data + 2));
                fVar20 = de::clamp<float>(fVar20,0.0,1.0);
                pvVar13 = std::
                          vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                          ::operator[](&scene->lines,(long)(int)wb);
                tcu::operator*((tcu *)(colorMinF.m_data + 1),fVar20,pvVar13->colors + 1);
                tcu::operator+((tcu *)local_934,&local_944,
                               (Vector<float,_4> *)(colorMinF.m_data + 1));
                fVar20 = Vector<float,_4>::x((Vector<float,_4> *)local_904);
                pVVar1 = (Vector<int,_3> *)
                         ((long)&candidates.
                                 super__Vector_base<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
                iVar4 = Vector<int,_3>::x(pVVar1);
                iVar5 = Vector<int,_3>::x(pVVar1);
                fVar20 = de::clamp<float>(fVar20 * (float)iVar4,0.0,(float)iVar5);
                fVar21 = Vector<float,_4>::y((Vector<float,_4> *)local_904);
                pVVar1 = (Vector<int,_3> *)
                         ((long)&candidates.
                                 super__Vector_base<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
                iVar4 = Vector<int,_3>::y(pVVar1);
                iVar5 = Vector<int,_3>::y(pVVar1);
                fVar21 = de::clamp<float>(fVar21 * (float)iVar4,0.0,(float)iVar5);
                fVar22 = Vector<float,_4>::z((Vector<float,_4> *)local_904);
                iVar4 = Vector<int,_3>::z(pVVar1);
                iVar5 = Vector<int,_3>::z(pVVar1);
                fVar22 = de::clamp<float>(fVar22 * (float)iVar4,0.0,(float)iVar5);
                Vector<float,_3>::Vector
                          ((Vector<float,_3> *)(colorMaxF.m_data + 1),fVar20,fVar21,fVar22);
                fVar20 = Vector<float,_4>::x((Vector<float,_4> *)local_934);
                pVVar1 = (Vector<int,_3> *)
                         ((long)&candidates.
                                 super__Vector_base<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
                iVar4 = Vector<int,_3>::x(pVVar1);
                iVar5 = Vector<int,_3>::x(pVVar1);
                fVar20 = de::clamp<float>(fVar20 * (float)iVar4,0.0,(float)iVar5);
                fVar21 = Vector<float,_4>::y((Vector<float,_4> *)local_934);
                pVVar1 = (Vector<int,_3> *)
                         ((long)&candidates.
                                 super__Vector_base<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
                iVar4 = Vector<int,_3>::y(pVVar1);
                iVar5 = Vector<int,_3>::y(pVVar1);
                fVar21 = de::clamp<float>(fVar21 * (float)iVar4,0.0,(float)iVar5);
                fVar22 = Vector<float,_4>::z((Vector<float,_4> *)local_934);
                iVar4 = Vector<int,_3>::z(pVVar1);
                iVar5 = Vector<int,_3>::z(pVVar1);
                fVar22 = de::clamp<float>(fVar22 * (float)iVar4,0.0,(float)iVar5);
                Vector<float,_3>::Vector
                          ((Vector<float,_3> *)(colorMin.m_data + 1),fVar20,fVar21,fVar22);
                fVar20 = Vector<float,_3>::x((Vector<float,_3> *)(colorMaxF.m_data + 1));
                fVar20 = ::deFloatFloor(fVar20);
                fVar21 = Vector<float,_3>::y((Vector<float,_3> *)(colorMaxF.m_data + 1));
                fVar21 = ::deFloatFloor(fVar21);
                fVar22 = Vector<float,_3>::z((Vector<float,_3> *)(colorMaxF.m_data + 1));
                fVar22 = ::deFloatFloor(fVar22);
                Vector<int,_3>::Vector
                          ((Vector<int,_3> *)(colorMax.m_data + 1),(int)fVar20,(int)fVar21,
                           (int)fVar22);
                fVar20 = Vector<float,_3>::x((Vector<float,_3> *)(colorMin.m_data + 1));
                fVar20 = deFloatCeil(fVar20);
                fVar21 = Vector<float,_3>::y((Vector<float,_3> *)(colorMin.m_data + 1));
                fVar21 = deFloatCeil(fVar21);
                fVar22 = Vector<float,_3>::z((Vector<float,_3> *)(colorMin.m_data + 1));
                fVar22 = deFloatCeil(fVar22);
                Vector<int,_3>::Vector
                          ((Vector<int,_3> *)((long)&interpolationCandidate + 4),(int)fVar20,
                           (int)fVar21,(int)fVar22);
                iVar4 = Vector<int,_3>::x((Vector<int,_3> *)&lineSurroundingCoverage);
                iVar5 = Vector<int,_3>::x((Vector<int,_3> *)(colorMax.m_data + 1));
                if (iVar5 <= iVar4) {
                  iVar4 = Vector<int,_3>::y((Vector<int,_3> *)&lineSurroundingCoverage);
                  iVar5 = Vector<int,_3>::y((Vector<int,_3> *)(colorMax.m_data + 1));
                  if (iVar5 <= iVar4) {
                    iVar4 = Vector<int,_3>::z((Vector<int,_3> *)&lineSurroundingCoverage);
                    iVar5 = Vector<int,_3>::z((Vector<int,_3> *)(colorMax.m_data + 1));
                    if (iVar5 <= iVar4) {
                      iVar4 = Vector<int,_3>::x((Vector<int,_3> *)&lineSurroundingCoverage);
                      iVar5 = Vector<int,_3>::x((Vector<int,_3> *)
                                                ((long)&interpolationCandidate + 4));
                      if (iVar4 <= iVar5) {
                        iVar4 = Vector<int,_3>::y((Vector<int,_3> *)&lineSurroundingCoverage);
                        iVar5 = Vector<int,_3>::y((Vector<int,_3> *)
                                                  ((long)&interpolationCandidate + 4));
                        if (iVar4 <= iVar5) {
                          iVar4 = Vector<int,_3>::z((Vector<int,_3> *)&lineSurroundingCoverage);
                          iVar5 = Vector<int,_3>::z((Vector<int,_3> *)
                                                    ((long)&interpolationCandidate + 4));
                          if (iVar4 <= iVar5) {
                            bVar3 = true;
                            break;
                          }
                        }
                      }
                    }
                  }
                }
                if (errorMask.m_pixels.m_cap._4_4_ < 4) {
                  lVar14 = (long)minorOffset;
                  minorOffset = minorOffset + 1;
                  local_99c._12_8_ =
                       candidate.interpolationCandidates[lVar14 + -1].valueRangeMax.m_data + 1;
                  *(int (*) [2])local_99c._12_8_ = local_8d8.m_data;
                  candidate.interpolationCandidates[lVar14].colorMin.m_data[0] = colorMin.m_data[0];
                  *(undefined8 *)candidate.interpolationCandidates[lVar14].interpolationPoint.m_data
                       = colorMax.m_data._4_8_;
                  candidate.interpolationCandidates[lVar14].colorMax.m_data[0] = colorMax.m_data[0];
                  *(undefined8 *)(candidate.interpolationCandidates[lVar14].colorMin.m_data + 1) =
                       stack0xfffffffffffff67c;
                  candidate.interpolationCandidates[lVar14].colorMinF.m_data[0] =
                       colorMinF.m_data[0];
                  *(undefined8 *)(candidate.interpolationCandidates[lVar14].colorMax.m_data + 1) =
                       colorMaxF.m_data._4_8_;
                  candidate.interpolationCandidates[lVar14].colorMaxF.m_data[0] =
                       colorMaxF.m_data[0];
                  *(undefined8 *)(candidate.interpolationCandidates[lVar14].colorMinF.m_data + 1) =
                       colorMin.m_data._4_8_;
                  Vector<float,_4>::swizzle
                            ((Vector<float,_4> *)(local_9a8 + 0xc),(int)local_904,0,1);
                  *(undefined4 *)(local_99c._12_8_ + 0x40) = local_99c._8_4_;
                  *(undefined8 *)(local_99c._12_8_ + 0x38) = local_99c._0_8_;
                  Vector<float,_4>::swizzle((Vector<float,_4> *)local_9a8,(int)local_934,0,1);
                  *(undefined8 *)(local_99c._12_8_ + 0x44) = local_9a8._0_8_;
                  *(undefined4 *)(local_99c._12_8_ + 0x4c) = local_9a8._8_4_;
                }
              }
            }
            if (bVar3) break;
            if ((errorMask.m_pixels.m_cap._4_4_ < 4) && (0 < minorOffset)) {
              std::
              vector<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>_>
              ::push_back((vector<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>_>
                           *)&dx,(value_type *)(rootPosition.m_data + 1));
            }
          }
          wb = (float)((int)wb + 1);
        }
        if (!bVar3) {
          effectiveLines.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage._4_4_ =
               effectiveLines.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
          msg._380_4_ = viewportSize.m_data[0];
          Surface::setPixel((Surface *)local_60,pixelNativeColor.m_data[2],color.m_value,
                            (RGBA)viewportSize.m_data[0]);
          errorMask.m_pixels.m_cap._4_4_ = errorMask.m_pixels.m_cap._4_4_ + 1;
          if (errorMask.m_pixels.m_cap._4_4_ < 4) {
            MessageBuilder::MessageBuilder
                      ((MessageBuilder *)&lineCandidateNdx,stack0xffffffffffffffd0);
            pMVar8 = MessageBuilder::operator<<
                               ((MessageBuilder *)&lineCandidateNdx,
                                (char (*) [28])"Found an invalid pixel at (");
            pMVar8 = MessageBuilder::operator<<(pMVar8,pixelNativeColor.m_data + 2);
            pMVar8 = MessageBuilder::operator<<(pMVar8,(char (*) [2])0x1362a23);
            pMVar8 = MessageBuilder::operator<<(pMVar8,(int *)&color);
            pMVar8 = MessageBuilder::operator<<(pMVar8,(char (*) [4])0x136aa80);
            sVar7 = std::
                    vector<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>_>
                    ::size((vector<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>_>
                            *)&dx);
            candidate_1._4_4_ = (undefined4)sVar7;
            pMVar8 = MessageBuilder::operator<<(pMVar8,(int *)((long)&candidate_1 + 4));
            pMVar8 = MessageBuilder::operator<<
                               (pMVar8,(char (*) [38])" candidate reference value(s) found:\n");
            pMVar8 = MessageBuilder::operator<<(pMVar8,(char (*) [16])"\tPixel color:\t\t");
            pMVar8 = MessageBuilder::operator<<(pMVar8,(RGBA *)(pixelNativeColor.m_data + 1));
            pMVar8 = MessageBuilder::operator<<(pMVar8,(char (*) [2])0x1387264);
            pMVar8 = MessageBuilder::operator<<(pMVar8,(char (*) [17])"\tNative color:\t\t");
            pMVar8 = MessageBuilder::operator<<(pMVar8,(Vector<int,_3> *)&lineSurroundingCoverage);
            MessageBuilder::operator<<(pMVar8,(char (*) [2])0x1387264);
            candidate_1._0_4_ = 0;
            while( true ) {
              iVar4 = (int)candidate_1;
              sVar7 = std::
                      vector<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>_>
                      ::size((vector<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>_>
                              *)&dx);
              if ((int)sVar7 <= iVar4) break;
              pvStack_b40 = std::
                            vector<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>_>
                            ::operator[]((vector<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>_>
                                          *)&dx,(long)(int)candidate_1);
              pMVar8 = MessageBuilder::operator<<
                                 ((MessageBuilder *)&lineCandidateNdx,
                                  (char (*) [23])"\tCandidate line (line ");
              pMVar8 = MessageBuilder::operator<<(pMVar8,&pvStack_b40->lineNdx);
              MessageBuilder::operator<<(pMVar8,(char (*) [4])0x1379c5d);
              for (interpolationCandidate_1._4_4_ = 0;
                  interpolationCandidate_1._4_4_ < pvStack_b40->numCandidates;
                  interpolationCandidate_1._4_4_ = interpolationCandidate_1._4_4_ + 1) {
                local_b50 = pvStack_b40->interpolationCandidates + interpolationCandidate_1._4_4_;
                pMVar8 = MessageBuilder::operator<<
                                   ((MessageBuilder *)&lineCandidateNdx,
                                    (char (*) [40])"\t\tCandidate interpolation point (index ");
                pMVar8 = MessageBuilder::operator<<
                                   (pMVar8,(int *)((long)&interpolationCandidate_1 + 4));
                pMVar8 = MessageBuilder::operator<<(pMVar8,(char (*) [4])0x1379c5d);
                pMVar8 = MessageBuilder::operator<<
                                   (pMVar8,(char (*) [54])
                                           "\t\t\tRoot fragment position (non-replicated fragment): "
                                   );
                pMVar8 = MessageBuilder::operator<<(pMVar8,&local_b50->interpolationPoint);
                pMVar8 = MessageBuilder::operator<<(pMVar8,(char (*) [3])0x1315f3d);
                pMVar8 = MessageBuilder::operator<<
                                   (pMVar8,(char (*) [32])"\t\t\tReference native color min: ");
                pIVar15 = &local_b50->colorMin;
                Vector<int,_3>::Vector(&local_b68,0,0,0);
                clamp<int,3>((tcu *)&local_b5c,pIVar15,&local_b68,
                             (Vector<int,_3> *)
                             ((long)&candidates.
                                     super__Vector_base<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
                pMVar8 = MessageBuilder::operator<<(pMVar8,&local_b5c);
                pMVar8 = MessageBuilder::operator<<(pMVar8,(char (*) [2])0x1387264);
                pMVar8 = MessageBuilder::operator<<
                                   (pMVar8,(char (*) [32])"\t\t\tReference native color max: ");
                pIVar15 = &local_b50->colorMax;
                Vector<int,_3>::Vector(&local_b80,0,0,0);
                clamp<int,3>((tcu *)&local_b74,pIVar15,&local_b80,
                             (Vector<int,_3> *)
                             ((long)&candidates.
                                     super__Vector_base<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
                pMVar8 = MessageBuilder::operator<<(pMVar8,&local_b74);
                pMVar8 = MessageBuilder::operator<<(pMVar8,(char (*) [2])0x1387264);
                pMVar8 = MessageBuilder::operator<<
                                   (pMVar8,(char (*) [32])"\t\t\tReference native float min: ");
                pVVar16 = &local_b50->colorMinF;
                Vector<float,_3>::Vector(&local_b98,0.0,0.0,0.0);
                Vector<int,_3>::cast<float>((Vector<int,_3> *)&local_ba4);
                clamp<float,3>((tcu *)&local_b8c,pVVar16,&local_b98,&local_ba4);
                pMVar8 = MessageBuilder::operator<<(pMVar8,&local_b8c);
                pMVar8 = MessageBuilder::operator<<(pMVar8,(char (*) [2])0x1387264);
                pMVar8 = MessageBuilder::operator<<
                                   (pMVar8,(char (*) [32])"\t\t\tReference native float max: ");
                pVVar16 = &local_b50->colorMaxF;
                Vector<float,_3>::Vector(&local_bbc,0.0,0.0,0.0);
                Vector<int,_3>::cast<float>((Vector<int,_3> *)&local_bc8);
                clamp<float,3>((tcu *)&local_bb0,pVVar16,&local_bbc,&local_bc8);
                pMVar8 = MessageBuilder::operator<<(pMVar8,&local_bb0);
                pMVar8 = MessageBuilder::operator<<(pMVar8,(char (*) [2])0x1387264);
                pMVar8 = MessageBuilder::operator<<(pMVar8,(char (*) [10])"\t\t\tFmin:\t");
                pVVar16 = &local_b50->valueRangeMin;
                Vector<float,_3>::Vector(&local_be0,0.0,0.0,0.0);
                Vector<float,_3>::Vector(&local_bec,1.0,1.0,1.0);
                clamp<float,3>((tcu *)&local_bd4,pVVar16,&local_be0,&local_bec);
                pMVar8 = MessageBuilder::operator<<(pMVar8,&local_bd4);
                pMVar8 = MessageBuilder::operator<<(pMVar8,(char (*) [2])0x1387264);
                pMVar8 = MessageBuilder::operator<<(pMVar8,(char (*) [10])"\t\t\tFmax:\t");
                pVVar16 = &local_b50->valueRangeMax;
                Vector<float,_3>::Vector(&local_c04,0.0,0.0,0.0);
                Vector<float,_3>::Vector(&local_c10,1.0,1.0,1.0);
                clamp<float,3>((tcu *)&local_bf8,pVVar16,&local_c04,&local_c10);
                pMVar8 = MessageBuilder::operator<<(pMVar8,&local_bf8);
                MessageBuilder::operator<<(pMVar8,(char (*) [2])0x1387264);
              }
              candidate_1._0_4_ = (int)candidate_1 + 1;
            }
            MessageBuilder::operator<<
                      ((MessageBuilder *)&lineCandidateNdx,(EndMessageToken *)&TestLog::EndMessage);
            MessageBuilder::~MessageBuilder((MessageBuilder *)&lineCandidateNdx);
          }
        }
      }
      std::
      vector<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>_>
      ::~vector((vector<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>_>
                 *)&dx);
      pixelNativeColor.m_data[2] = pixelNativeColor.m_data[2] + 1;
    }
    color.m_value = color.m_value + 1;
  } while( true );
}

Assistant:

bool verifySinglesampleWideLineGroupInterpolation (const tcu::Surface& surface, const LineSceneSpec& scene, const RasterizationArguments& args, tcu::TestLog& log)
{
	DE_ASSERT(deFloatFrac(scene.lineWidth) != 0.5f); // rounding direction is not defined, disallow undefined cases
	DE_ASSERT(scene.lines.size() < 8); // coverage indices are stored as bitmask in a unsigned 8-bit ints

	enum
	{
		FLAG_ROOT_NOT_SET = (1u << 16)
	};

	const tcu::RGBA						invalidPixelColor	= tcu::RGBA(255, 0, 0, 255);
	const tcu::IVec2					viewportSize		= tcu::IVec2(surface.getWidth(), surface.getHeight());
	const int							errorFloodThreshold	= 4;
	int									errorCount			= 0;
	tcu::Surface						errorMask			(surface.getWidth(), surface.getHeight());
	int									invalidPixels		= 0;
	std::vector<tcu::Vec4>				effectiveLines		(scene.lines.size()); //!< packed (x0, y0, x1, y1)
	std::vector<bool>					lineIsXMajor		(scene.lines.size());

	// for each line, for every distinct major direction fragment, store root pixel location (along
	// minor direction);
	std::vector<std::vector<deUint32> >	rootPixelLocation	(scene.lines.size()); //!< packed [16b - flags] [16b - coordinate]

	// log format

	log << tcu::TestLog::Message << "Verifying rasterization result. Native format is RGB" << args.redBits << args.greenBits << args.blueBits << tcu::TestLog::EndMessage;
	if (args.redBits > 8 || args.greenBits > 8 || args.blueBits > 8)
		log << tcu::TestLog::Message << "Warning! More than 8 bits in a color channel, this may produce false negatives." << tcu::TestLog::EndMessage;

	// Reference renderer produces correct fragments using the diamond-exit-rule. Make 2D int array, store line coverage as a 8-bit bitfield
	// The map is used to find lines with potential coverage to a given pixel
	tcu::TextureLevel referenceLineMap(tcu::TextureFormat(tcu::TextureFormat::R, tcu::TextureFormat::UNSIGNED_INT8), surface.getWidth(), surface.getHeight());
	tcu::clear(referenceLineMap.getAccess(), tcu::IVec4(0, 0, 0, 0));

	tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	// calculate mask and effective line coordinates
	{
		std::vector<tcu::Vec4> screenspaceLines(scene.lines.size());

		genScreenSpaceLines(screenspaceLines, scene.lines, viewportSize);
		setMaskMapCoverageBitForLines(screenspaceLines, scene.lineWidth, referenceLineMap.getAccess());

		for (int lineNdx = 0; lineNdx < (int)scene.lines.size(); ++lineNdx)
		{
			const tcu::Vec2	lineScreenSpaceP0	= screenspaceLines[lineNdx].swizzle(0, 1);
			const tcu::Vec2	lineScreenSpaceP1	= screenspaceLines[lineNdx].swizzle(2, 3);
			const bool		isXMajor			= isPackedSSLineXMajor(screenspaceLines[lineNdx]);

			lineIsXMajor[lineNdx] = isXMajor;

			// wide line interpolations are calculated for a line moved in minor direction
			{
				const float		offsetLength	= (scene.lineWidth - 1.0f) / 2.0f;
				const tcu::Vec2	offsetDirection	= (isXMajor) ? (tcu::Vec2(0.0f, -1.0f)) : (tcu::Vec2(-1.0f, 0.0f));
				const tcu::Vec2	offset			= offsetDirection * offsetLength;

				effectiveLines[lineNdx] = tcu::Vec4(lineScreenSpaceP0.x() + offset.x(),
													lineScreenSpaceP0.y() + offset.y(),
													lineScreenSpaceP1.x() + offset.x(),
													lineScreenSpaceP1.y() + offset.y());
			}
		}
	}

	for (int lineNdx = 0; lineNdx < (int)scene.lines.size(); ++lineNdx)
	{
		// Calculate root pixel lookup table for this line. Since the implementation's fragment
		// major coordinate range might not be a subset of the correct line range (they are allowed
		// to vary by one pixel), we must extend the domain to cover whole viewport along major
		// dimension.
		//
		// Expanding line strip to (effectively) infinite line might result in exit-diamnod set
		// that is not a superset of the exit-diamond set of the line strip. In practice, this
		// won't be an issue, since the allow-one-pixel-variation rule should tolerate this even
		// if the original and extended line would resolve differently a diamond the line just
		// touches (precision lost in expansion changes enter/exit status).

		{
			const bool						isXMajor			= lineIsXMajor[lineNdx];
			const int						majorSize			= (isXMajor) ? (surface.getWidth()) : (surface.getHeight());
			rr::LineExitDiamondGenerator	diamondGenerator;
			rr::LineExitDiamond				diamonds[32];
			int								numRasterized		= DE_LENGTH_OF_ARRAY(diamonds);

			// Expand to effectively infinite line (endpoints are just one pixel over viewport boundaries)
			const tcu::Vec2					expandedP0		= getLineCoordAtAxisCoord(effectiveLines[lineNdx].swizzle(0, 1), effectiveLines[lineNdx].swizzle(2, 3), isXMajor, -1.0f);
			const tcu::Vec2					expandedP1		= getLineCoordAtAxisCoord(effectiveLines[lineNdx].swizzle(0, 1), effectiveLines[lineNdx].swizzle(2, 3), isXMajor, (float)majorSize + 1.0f);

			diamondGenerator.init(tcu::Vec4(expandedP0.x(), expandedP0.y(), 0.0f, 1.0f),
								  tcu::Vec4(expandedP1.x(), expandedP1.y(), 0.0f, 1.0f));

			rootPixelLocation[lineNdx].resize(majorSize, FLAG_ROOT_NOT_SET);

			while (numRasterized == DE_LENGTH_OF_ARRAY(diamonds))
			{
				diamondGenerator.rasterize(diamonds, DE_LENGTH_OF_ARRAY(diamonds), numRasterized);

				for (int packetNdx = 0; packetNdx < numRasterized; ++packetNdx)
				{
					const tcu::IVec2	fragPos			= diamonds[packetNdx].position;
					const int			majorPos		= (isXMajor) ? (fragPos.x()) : (fragPos.y());
					const int			rootPos			= (isXMajor) ? (fragPos.y()) : (fragPos.x());
					const deUint32		packed			= (deUint32)((deUint16)((deInt16)rootPos));

					// infinite line will generate some diamonds outside the viewport
					if (deInBounds32(majorPos, 0, majorSize))
					{
						DE_ASSERT((rootPixelLocation[lineNdx][majorPos] & FLAG_ROOT_NOT_SET) != 0u);
						rootPixelLocation[lineNdx][majorPos] = packed;
					}
				}
			}

			// Filled whole lookup table
			for (int majorPos = 0; majorPos < majorSize; ++majorPos)
				DE_ASSERT((rootPixelLocation[lineNdx][majorPos] & FLAG_ROOT_NOT_SET) == 0u);
		}
	}

	// Find all possible lines with coverage, check pixel color matches one of them

	for (int y = 1; y < surface.getHeight() - 1; ++y)
	for (int x = 1; x < surface.getWidth()  - 1; ++x)
	{
		const tcu::RGBA		color					= surface.getPixel(x, y);
		const tcu::IVec3	pixelNativeColor		= convertRGB8ToNativeFormat(color, args);	// Convert pixel color from rgba8 to the real pixel format. Usually rgba8 or 565
		int					lineCoverageSet			= 0;										// !< lines that may cover this fragment
		int					lineSurroundingCoverage = 0xFFFF;									// !< lines that will cover this fragment
		bool				matchFound				= false;
		const tcu::IVec3	formatLimit				((1 << args.redBits) - 1, (1 << args.greenBits) - 1, (1 << args.blueBits) - 1);

		std::vector<SingleSampleWideLineCandidate> candidates;

		// Find lines with possible coverage

		for (int dy = -1; dy < 2; ++dy)
		for (int dx = -1; dx < 2; ++dx)
		{
			const int coverage = referenceLineMap.getAccess().getPixelInt(x+dx, y+dy).x();

			lineCoverageSet			|= coverage;
			lineSurroundingCoverage	&= coverage;
		}

		// background color is possible?
		if (lineSurroundingCoverage == 0 && compareColors(color, tcu::RGBA::black(), args.redBits, args.greenBits, args.blueBits))
			continue;

		// Check those lines

		for (int lineNdx = 0; lineNdx < (int)scene.lines.size(); ++lineNdx)
		{
			if (((lineCoverageSet >> lineNdx) & 0x01) != 0)
			{
				const float						wa				= scene.lines[lineNdx].positions[0].w();
				const float						wb				= scene.lines[lineNdx].positions[1].w();
				const tcu::Vec2					pa				= effectiveLines[lineNdx].swizzle(0, 1);
				const tcu::Vec2					pb				= effectiveLines[lineNdx].swizzle(2, 3);

				// \note Wide line fragments are generated by replicating the root fragment for each
				//       fragment column (row for y-major). Calculate interpolation at the root
				//       fragment.
				const bool						isXMajor		= lineIsXMajor[lineNdx];
				const int						majorPosition	= (isXMajor) ? (x) : (y);
				const deUint32					minorInfoPacked	= rootPixelLocation[lineNdx][majorPosition];
				const int						minorPosition	= (int)((deInt16)((deUint16)(minorInfoPacked & 0xFFFFu)));
				const tcu::IVec2				idealRootPos	= (isXMajor) ? (tcu::IVec2(majorPosition, minorPosition)) : (tcu::IVec2(minorPosition, majorPosition));
				const tcu::IVec2				minorDirection	= (isXMajor) ? (tcu::IVec2(0, 1)) : (tcu::IVec2(1, 0));

				SingleSampleWideLineCandidate	candidate;

				candidate.lineNdx		= lineNdx;
				candidate.numCandidates	= 0;
				DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(candidate.interpolationCandidates) == 3);

				// Interpolation happens at the root fragment, which is then replicated in minor
				// direction. Search for implementation's root position near accurate root.
				for (int minorOffset = -1; minorOffset < 2; ++minorOffset)
				{
					const tcu::IVec2				rootPosition	= idealRootPos + minorOffset * minorDirection;

					// A fragment can be root fragment only if it exists
					// \note root fragment can "exist" outside viewport
					// \note no pixel format theshold since in this case allowing only black is more conservative
					if (deInBounds32(rootPosition.x(), 0, surface.getWidth()) &&
						deInBounds32(rootPosition.y(), 0, surface.getHeight()) &&
						isBlack(surface.getPixel(rootPosition.x(), rootPosition.y())))
					{
						continue;
					}

					const LineInterpolationRange	range			= calcSingleSampleLineInterpolationRange(pa, wa, pb, wb, rootPosition, args.subpixelBits);

					const tcu::Vec4					valueMin		= de::clamp(range.min.x(), 0.0f, 1.0f) * scene.lines[lineNdx].colors[0] + de::clamp(range.min.y(), 0.0f, 1.0f) * scene.lines[lineNdx].colors[1];
					const tcu::Vec4					valueMax		= de::clamp(range.max.x(), 0.0f, 1.0f) * scene.lines[lineNdx].colors[0] + de::clamp(range.max.y(), 0.0f, 1.0f) * scene.lines[lineNdx].colors[1];

					const tcu::Vec3					colorMinF		(de::clamp(valueMin.x() * (float)formatLimit.x(), 0.0f, (float)formatLimit.x()),
																	 de::clamp(valueMin.y() * (float)formatLimit.y(), 0.0f, (float)formatLimit.y()),
																	 de::clamp(valueMin.z() * (float)formatLimit.z(), 0.0f, (float)formatLimit.z()));
					const tcu::Vec3					colorMaxF		(de::clamp(valueMax.x() * (float)formatLimit.x(), 0.0f, (float)formatLimit.x()),
																	 de::clamp(valueMax.y() * (float)formatLimit.y(), 0.0f, (float)formatLimit.y()),
																	 de::clamp(valueMax.z() * (float)formatLimit.z(), 0.0f, (float)formatLimit.z()));
					const tcu::IVec3				colorMin		((int)deFloatFloor(colorMinF.x()),
																	 (int)deFloatFloor(colorMinF.y()),
																	 (int)deFloatFloor(colorMinF.z()));
					const tcu::IVec3				colorMax		((int)deFloatCeil (colorMaxF.x()),
																	 (int)deFloatCeil (colorMaxF.y()),
																	 (int)deFloatCeil (colorMaxF.z()));

					// Verify validity
					if (pixelNativeColor.x() < colorMin.x() ||
						pixelNativeColor.y() < colorMin.y() ||
						pixelNativeColor.z() < colorMin.z() ||
						pixelNativeColor.x() > colorMax.x() ||
						pixelNativeColor.y() > colorMax.y() ||
						pixelNativeColor.z() > colorMax.z())
					{
						if (errorCount < errorFloodThreshold)
						{
							// Store candidate information for logging
							SingleSampleWideLineCandidate::InterpolationPointCandidate& interpolationCandidate = candidate.interpolationCandidates[candidate.numCandidates++];
							DE_ASSERT(candidate.numCandidates <= DE_LENGTH_OF_ARRAY(candidate.interpolationCandidates));

							interpolationCandidate.interpolationPoint	= rootPosition;
							interpolationCandidate.colorMin				= colorMin;
							interpolationCandidate.colorMax				= colorMax;
							interpolationCandidate.colorMinF			= colorMinF;
							interpolationCandidate.colorMaxF			= colorMaxF;
							interpolationCandidate.valueRangeMin		= valueMin.swizzle(0, 1, 2);
							interpolationCandidate.valueRangeMax		= valueMax.swizzle(0, 1, 2);
						}
					}
					else
					{
						matchFound = true;
						break;
					}
				}

				if (!matchFound)
				{
					// store info for logging
					if (errorCount < errorFloodThreshold && candidate.numCandidates > 0)
						candidates.push_back(candidate);
				}
				else
				{
					// no need to check other lines
					break;
				}
			}
		}

		if (matchFound)
			continue;

		// invalid fragment
		++invalidPixels;
		errorMask.setPixel(x, y, invalidPixelColor);

		++errorCount;

		// don't fill the logs with too much data
		if (errorCount < errorFloodThreshold)
		{
			tcu::MessageBuilder msg(&log);

			msg	<< "Found an invalid pixel at (" << x << "," << y << "), " << (int)candidates.size() << " candidate reference value(s) found:\n"
				<< "\tPixel color:\t\t" << color << "\n"
				<< "\tNative color:\t\t" << pixelNativeColor << "\n";

			for (int lineCandidateNdx = 0; lineCandidateNdx < (int)candidates.size(); ++lineCandidateNdx)
			{
				const SingleSampleWideLineCandidate& candidate = candidates[lineCandidateNdx];

				msg << "\tCandidate line (line " << candidate.lineNdx << "):\n";

				for (int interpolationCandidateNdx = 0; interpolationCandidateNdx < candidate.numCandidates; ++interpolationCandidateNdx)
				{
					const SingleSampleWideLineCandidate::InterpolationPointCandidate& interpolationCandidate = candidate.interpolationCandidates[interpolationCandidateNdx];

					msg	<< "\t\tCandidate interpolation point (index " << interpolationCandidateNdx << "):\n"
						<< "\t\t\tRoot fragment position (non-replicated fragment): " << interpolationCandidate.interpolationPoint << ":\n"
						<< "\t\t\tReference native color min: " << tcu::clamp(interpolationCandidate.colorMin, tcu::IVec3(0,0,0), formatLimit) << "\n"
						<< "\t\t\tReference native color max: " << tcu::clamp(interpolationCandidate.colorMax, tcu::IVec3(0,0,0), formatLimit) << "\n"
						<< "\t\t\tReference native float min: " << tcu::clamp(interpolationCandidate.colorMinF, tcu::Vec3(0.0f, 0.0f, 0.0f), formatLimit.cast<float>()) << "\n"
						<< "\t\t\tReference native float max: " << tcu::clamp(interpolationCandidate.colorMaxF, tcu::Vec3(0.0f, 0.0f, 0.0f), formatLimit.cast<float>()) << "\n"
						<< "\t\t\tFmin:\t" << tcu::clamp(interpolationCandidate.valueRangeMin, tcu::Vec3(0.0f, 0.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 1.0f)) << "\n"
						<< "\t\t\tFmax:\t" << tcu::clamp(interpolationCandidate.valueRangeMax, tcu::Vec3(0.0f, 0.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 1.0f)) << "\n";
				}
			}

			msg << tcu::TestLog::EndMessage;
		}
	}

	// don't just hide failures
	if (errorCount > errorFloodThreshold)
		log << tcu::TestLog::Message << "Omitted " << (errorCount-errorFloodThreshold) << " pixel error description(s)." << tcu::TestLog::EndMessage;

	// report result
	if (invalidPixels)
	{
		log << tcu::TestLog::Message << invalidPixels << " invalid pixel(s) found." << tcu::TestLog::EndMessage;
		log << tcu::TestLog::ImageSet("Verification result", "Result of rendering")
			<< tcu::TestLog::Image("Result", "Result",			surface)
			<< tcu::TestLog::Image("ErrorMask", "ErrorMask",	errorMask)
			<< tcu::TestLog::EndImageSet;

		return false;
	}
	else
	{
		log << tcu::TestLog::Message << "No invalid pixels found." << tcu::TestLog::EndMessage;
		log << tcu::TestLog::ImageSet("Verification result", "Result of rendering")
			<< tcu::TestLog::Image("Result", "Result", surface)
			<< tcu::TestLog::EndImageSet;

		return true;
	}
}